

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_texture_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Instruction *i,bool sparse,
          bool *forward,SmallVector<unsigned_int,_8UL> *inherited_expressions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  ID id;
  uint32_t uVar3;
  ID chain;
  uint32_t uVar4;
  size_t sVar5;
  Variant *pVVar6;
  bool bVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  uint32_t uVar11;
  uint uVar12;
  uint32_t *puVar13;
  SPIRType *out_type;
  SPIRVariable *pSVar14;
  SPIRType *pSVar15;
  ulong uVar16;
  SPIRCombinedImageSampler *pSVar17;
  CompilerError *this_00;
  int iVar18;
  SmallVector<unsigned_int,_8UL> *ts_3;
  int iVar19;
  uint32_t uVar20;
  ulong uVar21;
  uint32_t *puVar22;
  string *expr;
  undefined1 local_180;
  undefined1 local_17c;
  uint32_t local_174;
  uint32_t local_168;
  uint32_t local_164;
  uint32_t local_160;
  uint local_15c;
  uint32_t local_14c;
  uint32_t local_148;
  uint32_t local_144;
  uint32_t local_140;
  string local_f8;
  uint32_t local_d8;
  uint32_t uStack_d4;
  uint32_t uStack_d0;
  uint uStack_cc;
  uint32_t local_c8;
  uint32_t uStack_c4;
  uint32_t uStack_c0;
  uint32_t uStack_bc;
  uint32_t local_b8;
  uint32_t uStack_b4;
  ulong uStack_b0;
  string local_a0;
  bool *local_80;
  string local_78;
  ulong local_58;
  SPIRType *pSStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_38;
  
  ts_3 = inherited_expressions;
  local_80 = forward;
  puVar13 = Compiler::stream(&this->super_Compiler,i);
  uVar2 = i->op;
  uVar11 = i->length;
  id.id = puVar13[2];
  uVar21 = (ulong)id.id;
  uVar3 = puVar13[3];
  out_type = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *puVar13);
  SmallVector<unsigned_int,_8UL>::reserve
            (inherited_expressions,
             (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
  sVar5 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
  (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar5] = uVar3;
  (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar5 + 1;
  bVar7 = Compiler::has_decoration(&this->super_Compiler,id,DecorationNonUniform);
  if (bVar7) {
    pSVar14 = Compiler::maybe_get_backing_variable(&this->super_Compiler,id.id);
    bVar7 = pSVar14 == (SPIRVariable *)0x0;
  }
  else {
    bVar7 = false;
  }
  switch(uVar2) {
  case 0x59:
  case 0x5a:
switchD_00340b01_caseD_133:
    uVar4 = puVar13[4];
    puVar22 = puVar13 + 5;
    iVar19 = uVar11 - 5;
    goto LAB_00340b28;
  case 0x5b:
  case 0x5c:
switchD_00340b01_caseD_135:
    puVar22 = puVar13 + 4;
    iVar19 = uVar11 - 4;
    bVar8 = 1;
    uVar4 = 0;
    local_180 = 0;
    break;
  case 0x5d:
  case 0x5e:
switchD_00340b01_caseD_137:
    uVar4 = puVar13[4];
    puVar22 = puVar13 + 5;
    iVar19 = uVar11 - 5;
    local_180 = 0;
    bVar8 = 1;
    break;
  case 0x5f:
  case 0x62:
switchD_00340b01_caseD_139:
    puVar22 = puVar13 + 4;
    iVar19 = uVar11 - 4;
    local_180 = 1;
    uVar4 = 0;
    goto LAB_00340b97;
  case 0x60:
switchD_00340b01_caseD_13a:
    bVar9 = (this->options).es;
    uVar12 = (this->options).version;
    if ((uVar12 < 0x136 & bVar9) == 1) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"textureGather requires ESSL 310.");
LAB_00341586:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_174 = puVar13[4];
    puVar22 = puVar13 + 5;
    iVar19 = uVar11 - 5;
    local_17c = 1;
    if (bVar9 == false && uVar12 < 400) {
      bVar9 = expression_is_constant_null(this,local_174);
      if (!bVar9) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"textureGather with component requires GLSL 400.");
        goto LAB_00341586;
      }
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"GL_ARB_texture_gather","");
      require_extension_internal(this,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
    }
    uVar4 = 0;
    local_180 = 0;
    bVar8 = 0;
    goto LAB_00340baf;
  case 0x61:
switchD_00340b01_caseD_13b:
    bVar9 = (this->options).es;
    uVar12 = (this->options).version;
    if ((uVar12 < 0x136 & bVar9) == 1) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"textureGather requires ESSL 310.");
      goto LAB_00341586;
    }
    if (bVar9 == false && uVar12 < 400) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"textureGather with depth compare requires GLSL 400.");
      goto LAB_00341586;
    }
    iVar19 = uVar11 - 5;
    puVar22 = puVar13 + 5;
    uVar4 = puVar13[4];
    local_180 = 0;
    local_17c = 1;
    bVar8 = 0;
    goto LAB_00340ba7;
  default:
    switch(uVar2) {
    case 0x133:
    case 0x134:
      goto switchD_00340b01_caseD_133;
    case 0x135:
    case 0x136:
      goto switchD_00340b01_caseD_135;
    case 0x137:
    case 0x138:
      goto switchD_00340b01_caseD_137;
    case 0x139:
      goto switchD_00340b01_caseD_139;
    case 0x13a:
      goto switchD_00340b01_caseD_13a;
    case 0x13b:
      goto switchD_00340b01_caseD_13b;
    default:
      puVar22 = puVar13 + 4;
      iVar19 = uVar11 - 4;
      uVar4 = 0;
    }
LAB_00340b28:
    local_180 = 0;
LAB_00340b97:
    bVar8 = 0;
  }
  local_17c = 0;
LAB_00340ba7:
  local_174 = 0;
LAB_00340baf:
  pSVar15 = Compiler::expression_type(&this->super_Compiler,id.id);
  pSVar15 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                       (pSVar15->super_IVariant).self.id);
  uVar16 = (ulong)(pSVar15->image).dim;
  iVar18 = 2;
  if (uVar16 < 6) {
    iVar18 = *(int *)(&DAT_0040c554 + uVar16 * 4);
  }
  if (uVar4 != 0) {
    SmallVector<unsigned_int,_8UL>::reserve
              (inherited_expressions,
               (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
    sVar5 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
    (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar5] = uVar4;
    (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar5 + 1;
  }
  if (iVar19 == 0) {
    uVar11 = 0;
    iVar19 = 0;
  }
  else {
    uVar11 = *puVar22;
    puVar22 = puVar22 + 1;
    iVar19 = iVar19 + -1;
  }
  bVar9 = (pSVar15->image).arrayed;
  if ((iVar19 == 0) || ((uVar11 & 1) == 0)) {
    local_168 = 0;
  }
  else {
    local_168 = *puVar22;
    puVar22 = puVar22 + 1;
    SmallVector<unsigned_int,_8UL>::reserve
              (inherited_expressions,
               (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
    sVar5 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
    (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar5] = local_168;
    (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar5 + 1;
    iVar19 = iVar19 + -1;
  }
  local_140 = 0;
  if ((iVar19 == 0) || ((uVar11 & 2) == 0)) {
    local_15c = 0;
  }
  else {
    local_15c = *puVar22;
    puVar22 = puVar22 + 1;
    SmallVector<unsigned_int,_8UL>::reserve
              (inherited_expressions,
               (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
    sVar5 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
    (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar5] = local_15c;
    (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar5 + 1;
    iVar19 = iVar19 + -1;
  }
  if ((iVar19 != 0) && ((uVar11 & 4) != 0)) {
    local_140 = *puVar22;
    puVar22 = puVar22 + 1;
    SmallVector<unsigned_int,_8UL>::reserve
              (inherited_expressions,
               (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
    sVar5 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
    (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar5] = local_140;
    (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar5 + 1;
    iVar19 = iVar19 + -1;
  }
  local_148 = 0;
  if ((iVar19 == 0) || ((uVar11 & 4) == 0)) {
    local_160 = 0;
  }
  else {
    local_160 = *puVar22;
    puVar22 = puVar22 + 1;
    SmallVector<unsigned_int,_8UL>::reserve
              (inherited_expressions,
               (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
    sVar5 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
    (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar5] = local_160;
    (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar5 + 1;
    iVar19 = iVar19 + -1;
  }
  if ((iVar19 != 0) && ((uVar11 & 8) != 0)) {
    local_148 = *puVar22;
    puVar22 = puVar22 + 1;
    SmallVector<unsigned_int,_8UL>::reserve
              (inherited_expressions,
               (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
    sVar5 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
    (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar5] = local_148;
    (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar5 + 1;
    iVar19 = iVar19 + -1;
  }
  local_144 = 0;
  if ((iVar19 == 0) || ((uVar11 & 0x10) == 0)) {
    local_164 = 0;
  }
  else {
    local_164 = *puVar22;
    puVar22 = puVar22 + 1;
    SmallVector<unsigned_int,_8UL>::reserve
              (inherited_expressions,
               (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
    sVar5 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
    (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar5] = local_164;
    (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar5 + 1;
    iVar19 = iVar19 + -1;
  }
  if ((iVar19 != 0) && ((uVar11 & 0x20) != 0)) {
    local_144 = *puVar22;
    puVar22 = puVar22 + 1;
    SmallVector<unsigned_int,_8UL>::reserve
              (inherited_expressions,
               (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
    sVar5 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
    (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar5] = local_144;
    (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar5 + 1;
    iVar19 = iVar19 + -1;
  }
  uVar20 = 0;
  if ((iVar19 == 0) || ((uVar11 & 0x40) == 0)) {
    local_14c = 0;
  }
  else {
    local_14c = *puVar22;
    puVar22 = puVar22 + 1;
    SmallVector<unsigned_int,_8UL>::reserve
              (inherited_expressions,
               (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
    sVar5 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
    (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar5] = local_14c;
    (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar5 + 1;
    iVar19 = iVar19 + -1;
  }
  if ((iVar19 != 0) && ((uVar11 & 0x80) != 0)) {
    uVar20 = *puVar22;
    SmallVector<unsigned_int,_8UL>::reserve
              (inherited_expressions,
               (inherited_expressions->super_VectorView<unsigned_int>).buffer_size + 1);
    sVar5 = (inherited_expressions->super_VectorView<unsigned_int>).buffer_size;
    (inherited_expressions->super_VectorView<unsigned_int>).ptr[sVar5] = uVar20;
    (inherited_expressions->super_VectorView<unsigned_int>).buffer_size = sVar5 + 1;
  }
  local_58 = (ulong)id.id;
  local_48 = (ulong)CONCAT12(bVar8,CONCAT11(local_17c,local_180));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  uStack_40 = (ulong)CONCAT15(uVar20 != 0,
                              CONCAT14(sparse,CONCAT13(uVar4 != 0,
                                                       CONCAT12(local_140 != 0 || local_160 != 0,
                                                                CONCAT11(local_148 != 0 ||
                                                                         local_164 != 0,
                                                                         local_144 != 0)))));
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = (ulong)local_15c;
  pSStack_50 = pSVar15;
  (*(this->super_Compiler)._vptr_Compiler[0x1e])(&local_f8,this);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  uVar11 = 0;
  if (sparse) {
    uVar11 = get_sparse_feedback_texel_id(this,puVar13[1]);
  }
  local_f8._M_dataplus._M_p._4_4_ = 0;
  local_f8._M_dataplus._M_p._0_4_ = id.id;
  local_f8.field_2._M_local_buf[1] = local_17c;
  local_f8.field_2._M_local_buf[0] = local_180;
  local_f8.field_2._M_local_buf[2] = bVar8;
  local_f8.field_2._M_allocated_capacity._3_5_ = 0;
  local_f8.field_2._12_4_ = iVar18 + (uint)bVar8 + (uint)bVar9;
  local_f8.field_2._8_4_ = uVar3;
  _local_d8 = CONCAT44(local_140,uVar4);
  _uStack_d0 = CONCAT44(local_15c,local_160);
  uVar3 = local_144;
  if ((local_144 == 0) && (uVar3 = local_148, local_148 == 0)) {
    uVar3 = local_164;
  }
  _local_c8 = CONCAT44(local_168,uVar3);
  _uStack_c0 = CONCAT44(local_14c,local_174);
  _local_b8 = CONCAT44(uVar20,uVar11);
  uStack_b0 = (ulong)CONCAT11(local_144 != 0,bVar7);
  local_f8._M_string_length = (size_type)pSVar15;
  (*(this->super_Compiler)._vptr_Compiler[0x1f])(&local_a0,this,&local_f8,local_80);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p)
  ;
  paVar1 = &local_a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  bVar7 = (this->options).es;
  uVar12 = (this->options).version;
  if ((bVar7 & uVar12 < 300) == 0) {
    if (bVar7 == false && uVar12 < 0x82) goto LAB_00341193;
  }
  else if (bVar7 == false) {
LAB_00341193:
    bVar7 = Compiler::is_depth_image(&this->super_Compiler,pSVar15,id.id);
    if (bVar7) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  uVar12 = (uint)uVar2;
  if (((this->backend).comparison_image_samples_scalar != true) ||
     (((0xb < uVar12 - 0x57 || ((0x933U >> (uVar12 - 0x57 & 0x1f) & 1) == 0)) &&
      ((0xf < uVar12 - 0x131 || ((0x8133U >> (uVar12 - 0x131 & 0x1f) & 1) == 0))))))
  goto LAB_003412df;
  if ((uVar21 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar6 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar6[uVar21].type == TypeCombinedImageSampler)) {
    pSVar17 = Variant::get<spirv_cross::SPIRCombinedImageSampler>(pVVar6 + uVar21);
  }
  else {
    pSVar17 = (SPIRCombinedImageSampler *)0x0;
  }
  chain.id = id.id;
  if (pSVar17 == (SPIRCombinedImageSampler *)0x0) {
LAB_00341246:
    bVar9 = Compiler::is_depth_image(&this->super_Compiler,pSVar15,id.id);
  }
  else {
    chain.id = (pSVar17->image).id;
    bVar7 = Compiler::is_depth_image(&this->super_Compiler,pSVar15,(pSVar17->image).id);
    bVar9 = true;
    if (!bVar7) goto LAB_00341246;
  }
  pSVar14 = Compiler::maybe_get_backing_variable(&this->super_Compiler,chain.id);
  bVar7 = bVar9;
  if (pSVar14 != (SPIRVariable *)0x0) {
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         *(uint *)&(pSVar14->super_IVariant).field_0xc);
    bVar10 = Compiler::is_depth_image
                       (&this->super_Compiler,pSVar15,(pSVar14->super_IVariant).self.id);
    bVar7 = true;
    if (!bVar10) {
      bVar7 = bVar9;
    }
  }
  if (bVar7 != false) {
    remap_swizzle(&local_a0,this,out_type,1,__return_storage_ptr__);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
LAB_003412df:
  if (((!sparse) && ((this->backend).support_small_type_sampling_result == false)) &&
     (out_type->width < 0x20)) {
    type_to_glsl_constructor_abi_cxx11_(&local_78,this,out_type);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_a0,(spirv_cross *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40a721,
               (char (*) [2])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x415df5,
               (char (*) [2])ts_3);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  if (uVar12 == 0x62) {
    remap_swizzle(&local_a0,this,out_type,4,__return_storage_ptr__);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::to_texture_op(const Instruction &i, bool sparse, bool *forward,
                                        SmallVector<uint32_t> &inherited_expressions)
{
	auto *ops = stream(i);
	auto op = static_cast<Op>(i.op);
	uint32_t length = i.length;

	uint32_t result_type_id = ops[0];
	VariableID img = ops[2];
	uint32_t coord = ops[3];
	uint32_t dref = 0;
	uint32_t comp = 0;
	bool gather = false;
	bool proj = false;
	bool fetch = false;
	bool nonuniform_expression = false;
	const uint32_t *opt = nullptr;

	auto &result_type = get<SPIRType>(result_type_id);

	inherited_expressions.push_back(coord);
	if (has_decoration(img, DecorationNonUniform) && !maybe_get_backing_variable(img))
		nonuniform_expression = true;

	switch (op)
	{
	case OpImageSampleDrefImplicitLod:
	case OpImageSampleDrefExplicitLod:
	case OpImageSparseSampleDrefImplicitLod:
	case OpImageSparseSampleDrefExplicitLod:
		dref = ops[4];
		opt = &ops[5];
		length -= 5;
		break;

	case OpImageSampleProjDrefImplicitLod:
	case OpImageSampleProjDrefExplicitLod:
	case OpImageSparseSampleProjDrefImplicitLod:
	case OpImageSparseSampleProjDrefExplicitLod:
		dref = ops[4];
		opt = &ops[5];
		length -= 5;
		proj = true;
		break;

	case OpImageDrefGather:
	case OpImageSparseDrefGather:
		dref = ops[4];
		opt = &ops[5];
		length -= 5;
		gather = true;
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("textureGather requires ESSL 310.");
		else if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("textureGather with depth compare requires GLSL 400.");
		break;

	case OpImageGather:
	case OpImageSparseGather:
		comp = ops[4];
		opt = &ops[5];
		length -= 5;
		gather = true;
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("textureGather requires ESSL 310.");
		else if (!options.es && options.version < 400)
		{
			if (!expression_is_constant_null(comp))
				SPIRV_CROSS_THROW("textureGather with component requires GLSL 400.");
			require_extension_internal("GL_ARB_texture_gather");
		}
		break;

	case OpImageFetch:
	case OpImageSparseFetch:
	case OpImageRead: // Reads == fetches in Metal (other langs will not get here)
		opt = &ops[4];
		length -= 4;
		fetch = true;
		break;

	case OpImageSampleProjImplicitLod:
	case OpImageSampleProjExplicitLod:
	case OpImageSparseSampleProjImplicitLod:
	case OpImageSparseSampleProjExplicitLod:
		opt = &ops[4];
		length -= 4;
		proj = true;
		break;

	default:
		opt = &ops[4];
		length -= 4;
		break;
	}

	// Bypass pointers because we need the real image struct
	auto &type = expression_type(img);
	auto &imgtype = get<SPIRType>(type.self);

	uint32_t coord_components = 0;
	switch (imgtype.image.dim)
	{
	case spv::Dim1D:
		coord_components = 1;
		break;
	case spv::Dim2D:
		coord_components = 2;
		break;
	case spv::Dim3D:
		coord_components = 3;
		break;
	case spv::DimCube:
		coord_components = 3;
		break;
	case spv::DimBuffer:
		coord_components = 1;
		break;
	default:
		coord_components = 2;
		break;
	}

	if (dref)
		inherited_expressions.push_back(dref);

	if (proj)
		coord_components++;
	if (imgtype.image.arrayed)
		coord_components++;

	uint32_t bias = 0;
	uint32_t lod = 0;
	uint32_t grad_x = 0;
	uint32_t grad_y = 0;
	uint32_t coffset = 0;
	uint32_t offset = 0;
	uint32_t coffsets = 0;
	uint32_t sample = 0;
	uint32_t minlod = 0;
	uint32_t flags = 0;

	if (length)
	{
		flags = *opt++;
		length--;
	}

	auto test = [&](uint32_t &v, uint32_t flag) {
		if (length && (flags & flag))
		{
			v = *opt++;
			inherited_expressions.push_back(v);
			length--;
		}
	};

	test(bias, ImageOperandsBiasMask);
	test(lod, ImageOperandsLodMask);
	test(grad_x, ImageOperandsGradMask);
	test(grad_y, ImageOperandsGradMask);
	test(coffset, ImageOperandsConstOffsetMask);
	test(offset, ImageOperandsOffsetMask);
	test(coffsets, ImageOperandsConstOffsetsMask);
	test(sample, ImageOperandsSampleMask);
	test(minlod, ImageOperandsMinLodMask);

	TextureFunctionBaseArguments base_args = {};
	base_args.img = img;
	base_args.imgtype = &imgtype;
	base_args.is_fetch = fetch != 0;
	base_args.is_gather = gather != 0;
	base_args.is_proj = proj != 0;

	string expr;
	TextureFunctionNameArguments name_args = {};

	name_args.base = base_args;
	name_args.has_array_offsets = coffsets != 0;
	name_args.has_offset = coffset != 0 || offset != 0;
	name_args.has_grad = grad_x != 0 || grad_y != 0;
	name_args.has_dref = dref != 0;
	name_args.is_sparse_feedback = sparse;
	name_args.has_min_lod = minlod != 0;
	name_args.lod = lod;
	expr += to_function_name(name_args);
	expr += "(";

	uint32_t sparse_texel_id = 0;
	if (sparse)
		sparse_texel_id = get_sparse_feedback_texel_id(ops[1]);

	TextureFunctionArguments args = {};
	args.base = base_args;
	args.coord = coord;
	args.coord_components = coord_components;
	args.dref = dref;
	args.grad_x = grad_x;
	args.grad_y = grad_y;
	args.lod = lod;
	args.has_array_offsets = coffsets != 0;

	if (coffsets)
		args.offset = coffsets;
	else if (coffset)
		args.offset = coffset;
	else
		args.offset = offset;

	args.bias = bias;
	args.component = comp;
	args.sample = sample;
	args.sparse_texel = sparse_texel_id;
	args.min_lod = minlod;
	args.nonuniform_expression = nonuniform_expression;
	expr += to_function_args(args, forward);
	expr += ")";

	// texture(samplerXShadow) returns float. shadowX() returns vec4, but only in desktop GLSL. Swizzle here.
	if (is_legacy() && !options.es && is_depth_image(imgtype, img))
		expr += ".r";

	// Sampling from a texture which was deduced to be a depth image, might actually return 1 component here.
	// Remap back to 4 components as sampling opcodes expect.
	if (backend.comparison_image_samples_scalar && image_opcode_is_sample_no_dref(op))
	{
		bool image_is_depth = false;
		const auto *combined = maybe_get<SPIRCombinedImageSampler>(img);
		VariableID image_id = combined ? combined->image : img;

		if (combined && is_depth_image(imgtype, combined->image))
			image_is_depth = true;
		else if (is_depth_image(imgtype, img))
			image_is_depth = true;

		// We must also check the backing variable for the image.
		// We might have loaded an OpImage, and used that handle for two different purposes.
		// Once with comparison, once without.
		auto *image_variable = maybe_get_backing_variable(image_id);
		if (image_variable && is_depth_image(get<SPIRType>(image_variable->basetype), image_variable->self))
			image_is_depth = true;

		if (image_is_depth)
			expr = remap_swizzle(result_type, 1, expr);
	}

	if (!sparse && !backend.support_small_type_sampling_result && result_type.width < 32)
	{
		// Just value cast (narrowing) to expected type since we cannot rely on narrowing to work automatically.
		// Hopefully compiler picks this up and converts the texturing instruction to the appropriate precision.
		expr = join(type_to_glsl_constructor(result_type), "(", expr, ")");
	}

	// Deals with reads from MSL. We might need to downconvert to fewer components.
	if (op == OpImageRead)
		expr = remap_swizzle(result_type, 4, expr);

	return expr;
}